

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>::
HDivDirectionsMaster
          (TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>
           *this,TPZFMatrix<double> *directions)

{
  int i;
  long lVar1;
  TPZFNMatrix<9,_double> gradx;
  TPZFMatrix<double> local_110;
  double local_80 [10];
  
  local_110.fElem = local_80;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_110.fSize = 9;
  local_110.fGiven = local_110.fElem;
  TPZVec<int>::TPZVec(&local_110.fPivot.super_TPZVec<int>,0);
  local_110.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_110.fPivot.super_TPZVec<int>.fStore = local_110.fPivot.fExtAlloc;
  local_110.fPivot.super_TPZVec<int>.fNElements = 0;
  local_110.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_110.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_110.fWork.fStore = (double *)0x0;
  local_110.fWork.fNElements = 0;
  local_110.fWork.fNAlloc = 0;
  local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  TPZFMatrix<double>::operator=(&local_110,0.0);
  lVar1 = 0;
  while ((lVar1 < local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow &&
         (lVar1 < local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol))) {
    local_110.fElem[local_110.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar1 + lVar1] =
         1.0;
    lVar1 = lVar1 + 1;
    if (lVar1 != 1) {
      pztopology::TPZTriangle::ComputeHDivDirections<double>(&local_110,directions);
      TPZFMatrix<double>::~TPZFMatrix(&local_110,&PTR_PTR_0183dba8);
      return;
    }
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZGeoElRefLess<TGeo>::HDivDirectionsMaster(TPZFMatrix<REAL> &directions)
{
    TPZFNMatrix<9,REAL> gradx(3,TGeo::Dimension,0.);
    for (int i = 0; i < TGeo::Dimension; i++) {
        gradx(i,i) = 1.;
    }
    TGeo::ComputeHDivDirections(gradx, directions);
}